

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label_encoder.cc
# Opt level: O2

bool prometheus::detail::anon_unknown_2::needsEncoding(char c)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = false;
  if ((9 < (byte)(c - 0x30U)) && (0x19 < (byte)((c & 0xdfU) + 0xbf))) {
    iVar2 = (int)c;
    bVar1 = false;
    if ((1 < iVar2 - 0x2dU) && ((iVar2 != 0x5f && (iVar2 != 0x7e)))) {
      bVar1 = true;
    }
  }
  return bVar1;
}

Assistant:

bool needsEncoding(char c) {
  if (c >= 'a' && c <= 'z') {
    return false;
  }
  if (c >= 'A' && c <= 'Z') {
    return false;
  }
  if (c >= '0' && c <= '9') {
    return false;
  }
  if (c == '-' || c == '.' || c == '_' || c == '~') {
    return false;
  }
  return true;
}